

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::CombinePrimSpecRec
               (uint32_t depth,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  PrimSpec *pPVar3;
  bool bVar4;
  ostream *poVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it_00;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it_01;
  long lVar9;
  PrimSpec *child;
  pointer __x;
  bool bVar10;
  ostringstream ss_e;
  long *local_1c8;
  long local_1b8 [2];
  value_type *local_1a8 [14];
  ios_base local_138 [264];
  
  if (depth < 0x8000001) {
    PrimMetas::update_from(&dst->_metas,&src->_metas,false);
    p_Var8 = (src->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(src->_props)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find(&(dst->_props)._M_t,(key_type *)(p_Var8 + 1));
        if ((_Rb_tree_header *)cVar6._M_node == &(dst->_props)._M_t._M_impl.super__Rb_tree_header) {
          pmVar7 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](&dst->_props,(key_type *)(p_Var8 + 1));
          ::std::__cxx11::string::_M_assign((string *)pmVar7);
          (pmVar7->_attrib)._varying_authored = (bool)p_Var8[3].field_0x4;
          (pmVar7->_attrib)._variability = p_Var8[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar7->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar7->_attrib)._var,(any *)&p_Var8[4]._M_parent);
          (pmVar7->_attrib)._var._blocked = SUB41(p_Var8[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar7->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var8[5]._M_parent);
          (pmVar7->_attrib)._var._ts._dirty = SUB41(p_Var8[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar7->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var8[6]._M_parent
                    );
          AttrMetas::operator=(&(pmVar7->_attrib)._metas,(AttrMetas *)(p_Var8 + 7));
          *(_Base_ptr *)&pmVar7->_listOpQual = p_Var8[0x17]._M_parent;
          (pmVar7->_rel).type = *(Type *)&p_Var8[0x17]._M_left;
          Path::operator=(&(pmVar7->_rel).targetPath,(Path *)&p_Var8[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar7->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var8[0x1e]._M_parent);
          (pmVar7->_rel).listOpQual = p_Var8[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar7->_rel)._metas,(AttrMetas *)&p_Var8[0x1f]._M_parent);
          (pmVar7->_rel)._varying_authored = *(bool *)&p_Var8[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar7->_prop_value_type_name);
          pmVar7->_has_custom = *(bool *)&p_Var8[0x30]._M_right;
        }
        p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    __x = (src->_children).
          super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
          super__Vector_impl_data._M_start;
    pPVar2 = (src->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar10 = __x == pPVar2;
    if (!bVar10) {
      do {
        __it_00._M_current =
             (dst->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_start;
        pPVar3 = (dst->_children).
                 super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        lVar9 = ((long)pPVar3 - (long)__it_00._M_current >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
        __it_01._M_current = __it_00._M_current;
        local_1a8[0] = __x;
        if (0 < lVar9) {
          __it_01._M_current = __it_00._M_current + lVar9 * 4;
          lVar9 = lVar9 + 1;
          do {
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)local_1a8,__it_00);
            __it._M_current = __it_00._M_current;
            if (bVar4) goto LAB_001b313f;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)local_1a8,__it_00._M_current + 1);
            __it._M_current = __it_00._M_current + 1;
            if (bVar4) goto LAB_001b313f;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)local_1a8,__it_00._M_current + 2);
            __it._M_current = __it_00._M_current + 2;
            if (bVar4) goto LAB_001b313f;
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)local_1a8,__it_00._M_current + 3);
            __it._M_current = __it_00._M_current + 3;
            if (bVar4) goto LAB_001b313f;
            __it_00._M_current = __it_00._M_current + 4;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        lVar9 = ((long)pPVar3 - (long)__it_01._M_current >> 3) * -0x77dc7c4cf2ae9cdb;
        if (lVar9 == 1) {
LAB_001b3128:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                  ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                *)local_1a8,__it_01);
          __it._M_current = __it_01._M_current;
          if (!bVar4) {
            __it._M_current = pPVar3;
          }
        }
        else {
          __it._M_current = __it_01._M_current;
          if (lVar9 == 2) {
LAB_001b3105:
            bVar4 = __gnu_cxx::__ops::
                    _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                  *)local_1a8,__it);
            if (!bVar4) {
              __it_01._M_current = __it._M_current + 1;
              goto LAB_001b3128;
            }
          }
          else {
            __it._M_current = pPVar3;
            if ((lVar9 == 3) &&
               (bVar4 = __gnu_cxx::__ops::
                        _Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                        ::operator()((_Iter_pred<tinyusdz::(anonymous_namespace)::CombinePrimSpecRec(unsigned_int,tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                      *)local_1a8,__it_01), __it._M_current = __it_01._M_current,
               !bVar4)) {
              __it._M_current = __it_01._M_current + 1;
              goto LAB_001b3105;
            }
          }
        }
LAB_001b313f:
        if (__it._M_current == pPVar3) {
          ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                    (&dst->_children,__x);
        }
        else {
          bVar4 = CombinePrimSpecRec(depth + 1,__it._M_current,__x,warn,err);
          if (!bVar4) {
            return bVar10;
          }
        }
        __x = __x + 1;
        bVar10 = __x == pPVar2;
      } while (!bVar10);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"CombinePrimSpecRec",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"PrimSpec tree too deep.",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool CombinePrimSpecRec(uint32_t depth, PrimSpec &dst, const PrimSpec &src, std::string *warn,
                      std::string *err) {
  (void)warn;

  if (depth > (1024 * 1024 * 128)) {
    PUSH_ERROR_AND_RETURN("PrimSpec tree too deep.");
  }

  // Combine metadataum
  dst.metas().update_from(src.metas(), false);

  // Combine properties
  for (const auto &prop : src.props()) {
    // add if not existent
    if (dst.props().count(prop.first) == 0) {
      dst.props()[prop.first] = prop.second;
    }
  }

  // Combine child primspecs.
  for (auto &child : src.children()) {
    auto dst_it = std::find_if(
        dst.children().begin(), dst.children().end(),
        [&child](const PrimSpec &ps) { return ps.name() == child.name(); });

    // if exists, combine properties and children
    if (dst_it != dst.children().end()) {
      if (!CombinePrimSpecRec(depth + 1, (*dst_it), child, warn, err)) {
        return false;
      }
    }
    // otherwise add it
    else {
      dst.children().push_back(child);
    }
  }

  return true;
}